

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testArgumentParser.cxx
# Opt level: O0

bool anon_unknown.dwarf_14035::testArgumentParserStaticBool(void)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_3f0 [8];
  Result result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&result.ParsedKeywords.
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Result::Result((Result *)local_3f0);
  bVar1 = cmArgumentParser<(anonymous_namespace)::Result>::
          Parse<std::initializer_list<std::basic_string_view<char,std::char_traits<char>>>>
                    ((cmArgumentParser<(anonymous_namespace)::Result> *)
                     (anonymous_namespace)::parserStatic,(Result *)local_3f0,
                     (initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                     (anonymous_namespace)::args,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&result.ParsedKeywords.
                         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "ASSERT_TRUE(parserStatic.Parse(result, args, &unparsedArguments) == false) failed on line "
                            );
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x16a);
    std::operator<<(poVar2,"\n");
    unparsedArguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = false;
  }
  else {
    unparsedArguments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
         verifyResult((Result *)local_3f0,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&result.ParsedKeywords.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  Result::~Result((Result *)local_3f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&result.ParsedKeywords.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return unparsedArguments.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
}

Assistant:

bool testArgumentParserStaticBool()
{
  std::vector<std::string> unparsedArguments;
  Result result;
  ASSERT_TRUE(parserStatic.Parse(result, args, &unparsedArguments) == false);
  return verifyResult(result, unparsedArguments);
}